

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::Matchers::Floating::WithinAbsMatcher::describe_abi_cxx11_
          (string *__return_storage_ptr__,WithinAbsMatcher *this)

{
  string sStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  Detail::stringify<double>(&local_38,&this->m_margin);
  std::operator+(&local_78,"is within ",&local_38);
  std::operator+(&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_78,
                 " of ");
  Detail::stringify<double>(&sStack_98,&this->m_target);
  std::operator+(__return_storage_ptr__,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sStack_98);
  std::__cxx11::string::~string((string *)&sStack_98);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string WithinAbsMatcher::describe() const {
        return "is within " + ::Catch::Detail::stringify(m_margin) + " of " + ::Catch::Detail::stringify(m_target);
    }